

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

IGUITab * __thiscall
irr::gui::CGUIEnvironment::addTab
          (CGUIEnvironment *this,rect<int> *rectangle,IGUIElement *parent,s32 id)

{
  IGUITab *pIVar1;
  undefined8 in_RSI;
  s32 id_00;
  rect<int> *in_RDI;
  IGUIElement *unaff_retaddr;
  IGUIEnvironment *in_stack_00000008;
  CGUITab *in_stack_00000010;
  IGUITab *t;
  IReferenceCounted *in_stack_ffffffffffffffb8;
  
  id_00 = (s32)((ulong)in_RSI >> 0x20);
  pIVar1 = (IGUITab *)operator_new(0x160);
  CGUITab::CGUITab(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,id_00);
  IReferenceCounted::drop(in_stack_ffffffffffffffb8);
  return pIVar1;
}

Assistant:

IGUITab *CGUIEnvironment::addTab(const core::rect<s32> &rectangle,
		IGUIElement *parent, s32 id)
{
	IGUITab *t = new CGUITab(this, parent ? parent : this,
			rectangle, id);
	t->drop();
	return t;
}